

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  exception *e;
  char **in_stack_000000f8;
  int in_stack_00000104;
  
  iVar1 = embree::main(in_stack_00000104,in_stack_000000f8);
  return iVar1;
}

Assistant:

int main(int argc, char** argv)
{
  try {
    return embree::main(argc, argv);
  }
  catch (const std::exception& e) {
    std::cout << "Error: " << e.what() << std::endl;
    return 1;
  }
  catch (...) {
    std::cout << "Error: unknown exception caught." << std::endl;
    return 1;
  }
}